

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_initialize(plugin_manager manager,plugin p,loader_impl impl)

{
  set psVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  loader_impl_data pvVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  loader_impl_interface iface;
  undefined8 uVar11;
  long lVar12;
  
  if (impl->init == 0) {
    return 0;
  }
  pcVar3 = (char *)plugin_manager_library_path();
  if ((impl->config == (configuration)0x0) ||
     (lVar4 = configuration_value_type(impl->config,"loader_library_path",7), lVar4 != 0)) {
    lVar4 = 0;
  }
  else {
    sVar5 = strnlen(pcVar3,0x1000);
    lVar4 = value_create_string(pcVar3,sVar5);
    configuration_define(impl->config,"loader_library_path",lVar4);
  }
  puVar6 = (undefined8 *)plugin_iface(p);
  pvVar7 = (loader_impl_data)(*(code *)*puVar6)(impl,impl->config);
  impl->data = pvVar7;
  if (lVar4 != 0 && impl->config != (configuration)0x0) {
    configuration_undefine(impl->config,"loader_library_path");
    value_type_destroy(lVar4);
  }
  if (impl->data == (loader_impl_data)0x0) {
    uVar10 = plugin_name(p);
    pcVar3 = "Loader (%s) returned NULL value on the initialization";
    uVar11 = 0x1b2;
  }
  else {
    lVar4 = plugin_manager_impl(manager);
    lVar8 = vector_size(*(undefined8 *)(lVar4 + 8));
    if (lVar8 != 0) {
      lVar12 = 0;
      do {
        lVar9 = vector_at(*(undefined8 *)(lVar4 + 8),lVar12);
        if (*(plugin *)(lVar9 + 8) == p) {
          impl->init = 0;
          if (impl->config != (configuration)0x0) {
            iface = (loader_impl_interface)plugin_iface(p);
            loader_impl_configuration_execution_paths(iface,impl);
          }
          lVar4 = configuration_value_type(impl->config,"loader_library_path",7);
          if (lVar4 != 0) {
            pcVar3 = (char *)value_to_string(lVar4);
          }
          iVar2 = loader_impl_execution_path(p,impl,pcVar3);
          if (iVar2 != 0) {
            log_write_impl_va("metacall",0x1d7,"loader_impl_initialize",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                              ,3,"Error when loading path %s",pcVar3);
          }
          lVar4 = plugin_manager_impl(manager);
          lVar4 = *(long *)(lVar4 + 0x18);
          if ((lVar4 != 0) && (lVar8 = vector_size(lVar4), lVar8 != 0)) {
            lVar12 = 0;
            do {
              puVar6 = (undefined8 *)vector_at(lVar4,lVar12);
              pcVar3 = (char *)*puVar6;
              iVar2 = loader_impl_execution_path(p,impl,pcVar3);
              if (iVar2 != 0) {
                uVar10 = plugin_name(p);
                log_write_impl_va("metacall",0x1e7,"loader_impl_initialize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                  ,3,"Loader (%s) failed to define execution path: %s",uVar10,pcVar3
                                 );
              }
              lVar12 = lVar12 + 1;
            } while (lVar8 != lVar12);
          }
          psVar1 = impl->exec_path_map;
          uVar10 = plugin_name(p);
          lVar4 = set_get(psVar1,uVar10);
          if (lVar4 != 0) {
            lVar8 = vector_size(lVar4);
            if (lVar8 != 0) {
              lVar12 = 0;
              do {
                pcVar3 = (char *)vector_at(lVar4,lVar12);
                iVar2 = loader_impl_execution_path(p,impl,pcVar3);
                if (iVar2 != 0) {
                  uVar10 = plugin_name(p);
                  log_write_impl_va("metacall",0x1f9,"loader_impl_initialize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                                    ,3,"Loader (%s) failed to load path: %s",uVar10,pcVar3);
                }
                lVar12 = lVar12 + 1;
              } while (lVar8 != lVar12);
              return 0;
            }
            return 0;
          }
          return 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
    }
    uVar10 = plugin_name(p);
    plugin_name(p);
    pcVar3 = 
    "Loader (%s) was not registered in the initialization list, in order to solve this problem it must call to the function \'loader_initialization_register\' at the end of the initialization (i.e %s_loader_impl_initialize)"
    ;
    uVar11 = 0x1bc;
  }
  log_write_impl_va("metacall",uVar11,"loader_impl_initialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                    ,3,pcVar3,uVar10);
  return 1;
}

Assistant:

int loader_impl_initialize(plugin_manager manager, plugin p, loader_impl impl)
{
	static const char loader_library_path[] = "loader_library_path";
	value loader_library_path_value = NULL;
	char *library_path = NULL;
	vector script_paths, paths;

	if (impl->init == 0)
	{
		return 0;
	}

	/* Retrieve the library path */
	library_path = plugin_manager_library_path(manager);

	/* The library path priority order is the following:
	* 1) In the configuration <tag>_loader.json, the flag loader_library_path.
	* 2) The environment variable LOADER_LIBRARY_PATH.
	* 3) The directory of the path of (lib)metacall.{so,dll,dylib,...}
	* 4) Default install paths defined at compile time.
	*/

	/* Check if the configuration has a custom loader_library_path, otherwise set it up */
	if (impl->config != NULL && configuration_value_type(impl->config, loader_library_path, TYPE_STRING) == NULL)
	{
		loader_library_path_value = value_create_string(library_path, strnlen(library_path, LOADER_PATH_SIZE));
		configuration_define(impl->config, loader_library_path, loader_library_path_value);
	}

	/* Call to the loader initialize method */
	impl->data = loader_iface(p)->initialize(impl, impl->config);

	/* Undefine the library path field from config */
	if (impl->config != NULL && loader_library_path_value != NULL)
	{
		configuration_undefine(impl->config, loader_library_path);
		value_type_destroy(loader_library_path_value);
	}

	/* Verify that it the loader returned valid data on initialization */
	if (impl->data == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) returned NULL value on the initialization", plugin_name(p));
		return 1;
	}

	/* Verify that the loader has been registered into the initialization list */
	if (loader_impl_initialize_registered(manager, p) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) was not registered in the initialization list, "
											   "in order to solve this problem it must call to the function 'loader_initialization_register' "
											   "at the end of the initialization (i.e %s_loader_impl_initialize)",
			plugin_name(p), plugin_name(p));
		return 1;
	}

	impl->init = 0;

	if (impl->config != NULL)
	{
		loader_impl_configuration_execution_paths(loader_iface(p), impl);
	}

	/* The scripts path priority order is the following:
	* 1) The library path.
	* 2) The delimiter based paths defined in LOADER_SCRIPT_PATH.
	* 3) The execution paths defined before the initialization of a loader (for example, all metacall_execution_path(...) called before metacall_load_from_file(...)).
	*/

	/* Load the library path as execution path */
	loader_library_path_value = configuration_value_type(impl->config, loader_library_path, TYPE_STRING);

	if (loader_library_path_value != NULL)
	{
		library_path = value_to_string(loader_library_path_value);
	}

	if (loader_impl_execution_path(p, impl, library_path) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Error when loading path %s", library_path);
	}

	script_paths = plugin_manager_impl_type(manager, loader_manager_impl)->script_paths;

	/* Load the list of script paths (this allows to load multiple paths with a delimiter) */
	if (script_paths != NULL)
	{
		size_t iterator, size = vector_size(script_paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at_type(script_paths, iterator, char *);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to define execution path: %s", plugin_name(p), path);
			}
		}
	}

	paths = set_get(impl->exec_path_map, (const set_key)plugin_name(p));

	/* Load all execution paths (those are the delayed loading for the paths that has been defined before initializing the loader) */
	if (paths != NULL)
	{
		size_t iterator, size = vector_size(paths);

		for (iterator = 0; iterator < size; ++iterator)
		{
			char *path = vector_at(paths, iterator);

			if (loader_impl_execution_path(p, impl, path) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Loader (%s) failed to load path: %s", plugin_name(p), path);
			}
		}
	}

	return 0;
}